

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeachCli.hpp
# Opt level: O2

void __thiscall peach::cli::PeachCli::executeProgram(PeachCli *this,ifstream *ifs,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  ExprShPtr EVar3;
  undefined1 local_60 [16];
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  tokens;
  string programText;
  
  programText._M_dataplus._M_p = (pointer)&programText.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&programText,*(undefined8 *)(ifs + *(long *)(*(long *)ifs + -0x18) + 0xe8),
             0xffffffffffffffff,0,0xffffffff);
  fsm::FsmCollection::tokenizeText(&tokens,&this->tokenizator_,&programText,&this->keywords_);
  interpreter::Interpreter::interpretateLines
            (&this->interpreter_,
             (TokenIterator)
             tokens.
             super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (TokenIterator)
             tokens.
             super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  EVar3 = interpreter::Interpreter::getInterpretationResult((Interpreter *)local_60);
  iVar1 = (*(code *)**(undefined8 **)local_60._0_8_)
                    (local_60._0_8_,&this->scope_,
                     EVar3.
                     super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  std::
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  ::~vector(&tokens);
  std::__cxx11::string::~string((string *)&programText);
  return;
}

Assistant:

void executeProgram(std::ifstream &ifs, std::ostream &os)
    {
        std::string programText((std::istreambuf_iterator<char>(ifs)),
                                std::istreambuf_iterator<char>());
        auto tokens = tokenizator_.tokenizeText(programText, keywords_);
        try
        {
            interpreter_.interpretateLines(tokens.begin(), tokens.end());
            os << interpreter_.getInterpretationResult()->eval(scope_) << std::endl;
        }
        catch (const std::exception &e)
        {
            os << e.what() << '\n';
        }
    }